

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall
QTreeViewPrivate::insertViewItems(QTreeViewPrivate *this,int pos,int count,QTreeViewItem *viewItem)

{
  QList<QTreeViewItem> *this_00;
  long lVar1;
  pointer pQVar2;
  int *piVar3;
  long lVar4;
  
  this_00 = &this->viewItems;
  if (count != 0) {
    QtPrivate::QMovableArrayOps<QTreeViewItem>::insert
              ((QMovableArrayOps<QTreeViewItem> *)this_00,(long)pos,(long)count,viewItem);
  }
  QList<QTreeViewItem>::begin(this_00);
  pQVar2 = QList<QTreeViewItem>::data(this_00);
  lVar1 = (this->viewItems).d.size;
  lVar4 = (long)(count + pos);
  if (lVar4 < lVar1) {
    piVar3 = &pQVar2[lVar4].parentItem;
    do {
      if (pos <= *piVar3) {
        *piVar3 = *piVar3 + count;
      }
      lVar4 = lVar4 + 1;
      piVar3 = piVar3 + 10;
    } while (lVar4 < lVar1);
  }
  return;
}

Assistant:

void QTreeViewPrivate::insertViewItems(int pos, int count, const QTreeViewItem &viewItem)
{
    viewItems.insert(pos, count, viewItem);
    QTreeViewItem *items = viewItems.data();
    for (int i = pos + count; i < viewItems.size(); i++)
        if (items[i].parentItem >= pos)
            items[i].parentItem += count;
}